

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

int av1_get_active_map(AV1_COMP *cpi,uchar *new_map_16x16,int rows,int cols)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  int c;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  
  uVar4 = 0xffffffffffffffff;
  iVar3 = -1;
  if ((cpi->common).mi_params.mb_rows == rows) {
    if ((new_map_16x16 != (uchar *)0x0) && ((cpi->common).mi_params.mb_cols == cols)) {
      puVar11 = (cpi->enc_seg).map;
      iVar3 = (cpi->common).mi_params.mi_rows;
      iVar1 = (cpi->common).mi_params.mi_cols;
      memset(new_map_16x16,(uint)((cpi->active_map).enabled == 0),(long)(rows * cols));
      if ((cpi->active_map).enabled == 0) {
        uVar4 = 0;
      }
      else {
        uVar9 = iVar3 >> 2;
        uVar4 = 0;
        uVar5 = (ulong)(uint)(iVar1 >> 2);
        if (iVar1 >> 2 < 1) {
          uVar5 = uVar4;
        }
        uVar10 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar10 = uVar4;
        }
        puVar6 = puVar11 + (long)iVar1 + 1;
        lVar2 = (long)iVar1 * 2;
        puVar11 = puVar11 + 1;
        for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            new_map_16x16[uVar8] =
                 new_map_16x16[uVar8] |
                 (puVar6[uVar8 * 2] != '\a' ||
                 (puVar6[uVar8 * 2 + -1] != '\a' ||
                 (puVar11[uVar8 * 2] != '\a' || puVar11[uVar8 * 2 + -1] != '\a')));
          }
          new_map_16x16 = new_map_16x16 + cols;
          puVar6 = puVar6 + lVar2;
          puVar11 = puVar11 + lVar2;
        }
      }
    }
    iVar3 = (int)uVar4;
  }
  return iVar3;
}

Assistant:

int av1_get_active_map(AV1_COMP *cpi, unsigned char *new_map_16x16, int rows,
                       int cols) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  if (rows == mi_params->mb_rows && cols == mi_params->mb_cols &&
      new_map_16x16) {
    unsigned char *const seg_map_8x8 = cpi->enc_seg.map;
    const int mi_rows = mi_params->mi_rows;
    const int mi_cols = mi_params->mi_cols;
    const int row_scale = mi_size_high_log2[BLOCK_16X16];
    const int col_scale = mi_size_wide_log2[BLOCK_16X16];
    assert(mi_rows % 2 == 0);
    assert(mi_cols % 2 == 0);

    memset(new_map_16x16, !cpi->active_map.enabled, rows * cols);
    if (cpi->active_map.enabled) {
      for (int r = 0; r < (mi_rows >> row_scale); ++r) {
        for (int c = 0; c < (mi_cols >> col_scale); ++c) {
          // Cyclic refresh segments are considered active despite not having
          // AM_SEGMENT_ID_ACTIVE
          uint8_t temp = 0;
          temp |= seg_map_8x8[(2 * r + 0) * mi_cols + (2 * c + 0)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 0) * mi_cols + (2 * c + 1)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 1) * mi_cols + (2 * c + 0)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 1) * mi_cols + (2 * c + 1)] !=
                  AM_SEGMENT_ID_INACTIVE;
          new_map_16x16[r * cols + c] |= temp;
        }
      }
    }
    return 0;
  }

  return -1;
}